

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O1

ogt_vox_transform *
sample_keyframe_transform
          (ogt_vox_transform *__return_storage_ptr__,ogt_vox_keyframe_transform *keyframes,
          uint32_t num_keyframes,bool loop,uint32_t frame_index)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  
  if (num_keyframes == 0) {
    __assert_fail("(num_keyframes >= 1) && (\"need at least one keyframe to sample\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0x4f3,
                  "ogt_vox_transform sample_keyframe_transform(const ogt_vox_keyframe_transform *, uint32_t, bool, uint32_t)"
                 );
  }
  if (loop) {
    frame_index = compute_looped_frame_index
                            (keyframes->frame_index,keyframes[num_keyframes - 1].frame_index,
                             frame_index);
  }
  if (keyframes->frame_index < frame_index) {
    if (frame_index < keyframes[num_keyframes - 1].frame_index) {
      bVar1 = (int)num_keyframes < 2;
      if (1 < (int)num_keyframes) {
        uVar18 = (ulong)(num_keyframes - 2);
        uVar17 = keyframes[uVar18].frame_index;
        if (frame_index < uVar17) {
          uVar19 = num_keyframes - 3;
          do {
            bVar1 = (int)(uVar19 + 1) < 1;
            if ((int)(uVar19 + 1) < 1) goto LAB_00102a08;
            uVar18 = (ulong)uVar19;
            uVar17 = keyframes[uVar18].frame_index;
            uVar19 = uVar19 - 1;
          } while (frame_index < uVar17);
        }
        fVar20 = (float)(frame_index - uVar17) /
                 (float)((keyframes + 1)[uVar18].frame_index - uVar17);
        fVar21 = 1.0 - fVar20;
        fVar13 = keyframes[uVar18].transform.m00;
        fVar14 = keyframes[uVar18].transform.m01;
        fVar15 = keyframes[uVar18].transform.m02;
        fVar16 = keyframes[uVar18].transform.m03;
        fVar9 = keyframes[uVar18].transform.m10;
        fVar10 = keyframes[uVar18].transform.m11;
        fVar11 = keyframes[uVar18].transform.m12;
        fVar12 = keyframes[uVar18].transform.m13;
        fVar5 = keyframes[uVar18].transform.m20;
        fVar6 = keyframes[uVar18].transform.m21;
        fVar7 = keyframes[uVar18].transform.m22;
        fVar8 = keyframes[uVar18].transform.m23;
        fVar2 = keyframes[uVar18].transform.m31;
        fVar3 = keyframes[uVar18].transform.m32;
        fVar4 = keyframes[uVar18].transform.m33;
        __return_storage_ptr__->m30 = keyframes[uVar18].transform.m30;
        __return_storage_ptr__->m31 = fVar2;
        __return_storage_ptr__->m32 = fVar3;
        __return_storage_ptr__->m33 = fVar4;
        __return_storage_ptr__->m20 = fVar5;
        __return_storage_ptr__->m21 = fVar6;
        __return_storage_ptr__->m22 = fVar7;
        __return_storage_ptr__->m23 = fVar8;
        __return_storage_ptr__->m10 = fVar9;
        __return_storage_ptr__->m11 = fVar10;
        __return_storage_ptr__->m12 = fVar11;
        __return_storage_ptr__->m13 = fVar12;
        __return_storage_ptr__->m00 = fVar13;
        __return_storage_ptr__->m01 = fVar14;
        __return_storage_ptr__->m02 = fVar15;
        __return_storage_ptr__->m03 = fVar16;
        __return_storage_ptr__->m30 =
             (float)(int)((keyframes + 1)[uVar18].transform.m30 * fVar20 +
                         __return_storage_ptr__->m30 * fVar21);
        __return_storage_ptr__->m31 =
             (float)(int)((keyframes + 1)[uVar18].transform.m31 * fVar20 +
                         __return_storage_ptr__->m31 * fVar21);
        __return_storage_ptr__->m32 =
             (float)(int)(fVar20 * (keyframes + 1)[uVar18].transform.m32 +
                         fVar21 * __return_storage_ptr__->m32);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
      }
LAB_00102a08:
      __assert_fail("(0) && (\"shouldn\'t reach here\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                    ,0x50d,
                    "ogt_vox_transform sample_keyframe_transform(const ogt_vox_keyframe_transform *, uint32_t, bool, uint32_t)"
                   );
    }
    keyframes = keyframes + (num_keyframes - 1);
  }
  fVar13 = (keyframes->transform).m00;
  fVar14 = (keyframes->transform).m01;
  fVar15 = (keyframes->transform).m02;
  fVar16 = (keyframes->transform).m03;
  fVar9 = (keyframes->transform).m10;
  fVar10 = (keyframes->transform).m11;
  fVar11 = (keyframes->transform).m12;
  fVar12 = (keyframes->transform).m13;
  fVar5 = (keyframes->transform).m20;
  fVar6 = (keyframes->transform).m21;
  fVar7 = (keyframes->transform).m22;
  fVar8 = (keyframes->transform).m23;
  fVar2 = (keyframes->transform).m31;
  fVar3 = (keyframes->transform).m32;
  fVar4 = (keyframes->transform).m33;
  __return_storage_ptr__->m30 = (keyframes->transform).m30;
  __return_storage_ptr__->m31 = fVar2;
  __return_storage_ptr__->m32 = fVar3;
  __return_storage_ptr__->m33 = fVar4;
  __return_storage_ptr__->m20 = fVar5;
  __return_storage_ptr__->m21 = fVar6;
  __return_storage_ptr__->m22 = fVar7;
  __return_storage_ptr__->m23 = fVar8;
  __return_storage_ptr__->m10 = fVar9;
  __return_storage_ptr__->m11 = fVar10;
  __return_storage_ptr__->m12 = fVar11;
  __return_storage_ptr__->m13 = fVar12;
  __return_storage_ptr__->m00 = fVar13;
  __return_storage_ptr__->m01 = fVar14;
  __return_storage_ptr__->m02 = fVar15;
  __return_storage_ptr__->m03 = fVar16;
  return __return_storage_ptr__;
}

Assistant:

static ogt_vox_transform sample_keyframe_transform(const ogt_vox_keyframe_transform* keyframes, uint32_t num_keyframes, bool loop, uint32_t frame_index)
    {
        ogt_assert(num_keyframes >= 1, "need at least one keyframe to sample");
        if (loop) {
            frame_index = compute_looped_frame_index(keyframes[0].frame_index, keyframes[num_keyframes-1].frame_index, frame_index);
        }
        if (frame_index <= keyframes[0].frame_index)
            return keyframes[0].transform;
        if (frame_index >= keyframes[num_keyframes-1].frame_index)
            return keyframes[num_keyframes-1].transform;
        for (int32_t f = (int32_t)num_keyframes-2; f >= 0; f--) {
            if (frame_index >= keyframes[f].frame_index) {
                // orientation always snaps
                uint32_t next_frame = keyframes[f+1].frame_index;
                uint32_t curr_frame = keyframes[f+0].frame_index;
                float t = (frame_index - curr_frame)  / (float)(next_frame - curr_frame);
                float t_inv = 1.0f - t;
                // orientation always snaps to the earlier frame
                ogt_vox_transform curr_transform = keyframes[f+0].transform;
                // position gets interpolated with rounding towards zero - TODO(jpaver) or should it be -INF?
                const ogt_vox_transform& next_transform = keyframes[f+1].transform;
                curr_transform.m30 = (float)(int32_t)((next_transform.m30 * t) + (curr_transform.m30 * t_inv));
                curr_transform.m31 = (float)(int32_t)((next_transform.m31 * t) + (curr_transform.m31 * t_inv));
                curr_transform.m32 = (float)(int32_t)((next_transform.m32 * t) + (curr_transform.m32 * t_inv));
                return curr_transform;

            }
        }
        ogt_assert(0, "shouldn't reach here");
        return keyframes[0].transform;
    }